

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O0

void __thiscall
BmsNoteLane::GetNoteExistBar
          (BmsNoteLane *this,set<int,_std::less<int>,_std::allocator<int>_> *barmap)

{
  Iterator this_00;
  bool bVar1;
  pointer __x;
  _Self local_28;
  _Self local_20;
  Iterator i;
  set<int,_std::less<int>,_std::allocator<int>_> *barmap_local;
  BmsNoteLane *this_local;
  
  i._M_node = (_Base_ptr)barmap;
  local_20._M_node = (_Base_ptr)Begin(this);
  while( true ) {
    local_28._M_node = (_Base_ptr)End(this);
    bVar1 = std::operator!=(&local_20,&local_28);
    this_00 = i;
    if (!bVar1) break;
    __x = std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>::operator->(&local_20);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00._M_node,&__x->first);
    std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>::operator++(&local_20);
  }
  return;
}

Assistant:

void BmsNoteLane::GetNoteExistBar(std::set<barindex> &barmap) {
	for (Iterator i = Begin(); i != End(); ++i) {
		barmap.insert(i->first);
	}
}